

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

void __thiscall
boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::on
          (reporter<boost::ext::ut::v1_1_8::printer> *this,test_end param_2)

{
  printer *t;
  printer *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  char (*in_stack_ffffffffffffffd8) [7];
  printer *in_stack_ffffffffffffffe0;
  undefined5 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff5;
  undefined1 in_stack_fffffffffffffff6;
  undefined1 in_stack_fffffffffffffff7;
  undefined1 uVar1;
  
  if (in_RDI[2]._M_str < (char *)in_RDI[2]._M_len) {
    in_RDI->_M_str = in_RDI->_M_str + 1;
    uVar1 = 10;
    t = printer::operator<<(in_stack_ffffffffffffffe0,*in_stack_ffffffffffffffd8);
    printer::colors((printer *)(in_RDI + 3));
    printer::operator<<((printer *)
                        CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffff6,
                                                CONCAT15(in_stack_fffffffffffffff5,
                                                         in_stack_fffffffffffffff0))),in_RDI);
    this_00 = printer::operator<<(in_stack_ffffffffffffffe0,(char (*) [7])t);
    printer::colors((printer *)(in_RDI + 3));
    printer::operator<<((printer *)
                        CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffff6,
                                                CONCAT15(in_stack_fffffffffffffff5,
                                                         in_stack_fffffffffffffff0))),in_RDI);
    printer::operator<<(this_00,(char *)t);
  }
  else {
    in_RDI->_M_len = in_RDI->_M_len + 1;
    printer::colors((printer *)(in_RDI + 3));
    printer::operator<<((printer *)
                        CONCAT17(in_stack_fffffffffffffff7,
                                 CONCAT16(in_stack_fffffffffffffff6,
                                          CONCAT15(in_stack_fffffffffffffff5,
                                                   in_stack_fffffffffffffff0))),in_RDI);
    printer::operator<<(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    printer::colors((printer *)(in_RDI + 3));
    printer::operator<<((printer *)
                        CONCAT17(in_stack_fffffffffffffff7,
                                 CONCAT16(in_stack_fffffffffffffff6,
                                          CONCAT15(in_stack_fffffffffffffff5,
                                                   in_stack_fffffffffffffff0))),in_RDI);
    printer::operator<<(in_stack_ffffffffffffffe0,*in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

auto on(events::test_end) -> void {
      if (asserts_.fail > fails_) {
        ++tests_.fail;
        printer_ << '\n'
                 << printer_.colors().fail << "FAILED" << printer_.colors().none
                 << '\n';
      } else {
        ++tests_.pass;
        printer_ << printer_.colors().pass << "PASSED" << printer_.colors().none
                 << '\n';
      }
    }